

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

void __thiscall
siamese::RecoveryMatrixState::PopulateRows(RecoveryMatrixState *this,uint oldRows,uint newRows)

{
  ostringstream *this_00;
  RowInfo *pRVar1;
  OutputWorker *this_01;
  RecoveryPacket *pRVar2;
  LogStringBuffer local_1b8;
  
  if (oldRows < newRows) {
    pktalloc::LightVector<siamese::RecoveryMatrixState::RowInfo,_25U>::SetSize_Copy
              (&this->Rows,newRows);
    if (oldRows == 0) {
      pRVar2 = (RecoveryPacket *)&this->CheckedRegion->FirstRecovery;
    }
    else {
      pRVar2 = (this->Rows).DataPtr[(int)(oldRows - 1)].Recovery;
    }
    this_00 = &local_1b8.LogStream;
    for (; oldRows < newRows; oldRows = oldRows + 1) {
      pRVar2 = pRVar2->Next;
      pRVar1 = (this->Rows).DataPtr;
      pRVar1[(int)oldRows].Recovery = pRVar2;
      pRVar1[(int)oldRows].UsedForSolution = false;
      pRVar1[(int)oldRows].MatrixColumnCount = pRVar2->LostCount;
      if (DAT_0019e220 < 3) {
        local_1b8.ChannelName = Logger;
        local_1b8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,(string *)&DAT_0019e250);
        std::operator<<((ostream *)this_00,"*** Recovery packet: start=");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," Sum_Count=");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," LDPC_Count=");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      }
    }
  }
  return;
}

Assistant:

void RecoveryMatrixState::PopulateRows(const unsigned oldRows, const unsigned newRows)
{
    if (oldRows >= newRows)
        return;

    Rows.SetSize_Copy(newRows);

    RecoveryPacket* recovery;
    if (oldRows > 0)
        recovery = Rows.GetRef(oldRows - 1).Recovery->Next;
    else
        recovery = CheckedRegion->FirstRecovery;
    SIAMESE_DEBUG_ASSERT(recovery);

    for (unsigned rowIndex = oldRows; rowIndex < newRows; ++rowIndex, recovery = recovery->Next)
    {
        RowInfo* rowPtr = Rows.GetPtr(rowIndex);
        rowPtr->Recovery          = recovery;
        rowPtr->UsedForSolution   = false;
        rowPtr->MatrixColumnCount = recovery->LostCount;

        Logger.Info("*** Recovery packet: start=", recovery->Metadata.ColumnStart,  " Sum_Count=",  recovery->Metadata.SumCount,  " LDPC_Count=",  recovery->Metadata.LDPCCount);
    }
}